

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_cpu_features.c
# Opt level: O0

Node * CreatePrintfString(char *format,...)

{
  int iVar1;
  Node *pNVar2;
  char *in_RSI;
  char *in_RDI;
  int written;
  char *ptr;
  va_list arglist;
  undefined1 auStackY_e8 [8];
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_8;
  
  local_18 = auStackY_e8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  local_8 = in_RDI;
  iVar1 = vsnprintf(gBumpAllocator.ptr,gBumpAllocator.size,in_RDI,&local_28);
  if ((iVar1 < 0) || ((int)gBumpAllocator.size <= iVar1)) {
    internal_error();
  }
  BA_Bump((size_t)in_RSI);
  pNVar2 = CreateConstantString(in_RSI);
  return pNVar2;
}

Assistant:

static Node* CreatePrintfString(const char* format, ...) {
  va_list arglist;
  va_start(arglist, format);
  char* const ptr = gBumpAllocator.ptr;
  const int written = vsnprintf(ptr, gBumpAllocator.size, format, arglist);
  va_end(arglist);
  if (written < 0 || written >= (int)gBumpAllocator.size) internal_error();
  return CreateConstantString((char*)BA_Bump(written));
}